

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::ConvertToSampledImagePass::IsSamplerOfSampledImageDecoratedByDescriptorSetBinding
          (ConvertToSampledImagePass *this,Instruction *sampled_image_inst,
          DescriptorSetAndBinding *descriptor_set_binding)

{
  bool bVar1;
  uint32_t uVar2;
  DefUseManager *this_00;
  Instruction *pIVar3;
  undefined7 extraout_var;
  bool bVar4;
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  DescriptorSetAndBinding sampler_descriptor_set_binding;
  
  this_00 = IRContext::get_def_use_mgr((this->super_Pass).context_);
  uVar2 = Instruction::GetSingleWordInOperand(sampled_image_inst,1);
  pIVar3 = analysis::DefUseManager::GetDef(this_00,uVar2);
  if (pIVar3->opcode_ == OpLoad) {
    bVar4 = false;
    uVar2 = Instruction::GetSingleWordInOperand(pIVar3,0);
    pIVar3 = analysis::DefUseManager::GetDef(this_00,uVar2);
    bVar1 = GetDescriptorSetBinding(this,pIVar3,&sampler_descriptor_set_binding);
    if (bVar1) {
      iVar6 = -(uint)(sampler_descriptor_set_binding.descriptor_set ==
                     (*descriptor_set_binding).descriptor_set);
      iVar7 = -(uint)(sampler_descriptor_set_binding.binding == (*descriptor_set_binding).binding);
      auVar5._4_4_ = iVar6;
      auVar5._0_4_ = iVar6;
      auVar5._8_4_ = iVar7;
      auVar5._12_4_ = iVar7;
      iVar6 = movmskpd((int)CONCAT71(extraout_var,bVar1),auVar5);
      bVar4 = iVar6 == 3;
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool ConvertToSampledImagePass::
    IsSamplerOfSampledImageDecoratedByDescriptorSetBinding(
        Instruction* sampled_image_inst,
        const DescriptorSetAndBinding& descriptor_set_binding) {
  auto* def_use_mgr = context()->get_def_use_mgr();
  uint32_t sampler_id = sampled_image_inst->GetSingleWordInOperand(1u);
  auto* sampler_load = def_use_mgr->GetDef(sampler_id);
  if (sampler_load->opcode() != spv::Op::OpLoad) return false;
  auto* sampler = def_use_mgr->GetDef(sampler_load->GetSingleWordInOperand(0u));
  DescriptorSetAndBinding sampler_descriptor_set_binding;
  return GetDescriptorSetBinding(*sampler, &sampler_descriptor_set_binding) &&
         sampler_descriptor_set_binding == descriptor_set_binding;
}